

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_jit.c
# Opt level: O0

void jit_profile_callback(lua_State *L2,lua_State *L,int samples,int vmstate)

{
  TValue *pTVar1;
  uint64_t uVar2;
  int iVar3;
  char local_179;
  int status;
  char vmst;
  cTValue *tv;
  TValue key;
  int vmstate_local;
  int samples_local;
  lua_State *L_local;
  lua_State *L2_local;
  TValue *local_148;
  lua_State *local_140;
  undefined4 local_134;
  lua_State *local_130;
  TValue *local_128;
  lua_State *local_120;
  undefined4 local_114;
  lua_State *local_110;
  TValue *local_108;
  char *local_100;
  TValue *local_f8;
  lua_State *local_f0;
  uint32_t local_e4;
  TValue *local_e0;
  lua_State *local_d8;
  TValue *local_d0;
  lua_State *local_c8;
  undefined4 local_bc;
  lua_State *local_b8;
  TValue *local_b0;
  lua_State *local_a8;
  undefined4 local_9c;
  lua_State *local_98;
  TValue *local_90;
  char *local_88;
  TValue *local_80;
  lua_State *local_78;
  ulong local_70;
  TValue *local_68;
  lua_State *local_60;
  undefined4 local_54;
  ulong local_50;
  TValue *local_48;
  lua_State *local_40;
  undefined4 local_34;
  ulong local_30;
  TValue *local_28;
  char *local_20;
  TValue *local_18;
  lua_State *local_10;
  
  tv = (cTValue *)0x8000000000000066;
  key.field_4.i = vmstate;
  key.field_4.it = samples;
  _vmstate_local = L;
  L_local = L2;
  _status = lj_tab_get(L,(GCtab *)(*(ulong *)((L->glref).ptr64 + 0x110) & 0x7fffffffffff),
                       (cTValue *)&tv);
  local_140 = L_local;
  if ((int)(_status->field_4).it >> 0xf == -9) {
    local_179 = (char)key.field_4.i;
    local_68 = L_local->top;
    L_local->top = local_68 + 1;
    local_70 = _status->u64 & 0x7fffffffffff;
    local_60 = L_local;
    local_40 = L_local;
    local_54 = 0xfffffff7;
    local_34 = 0xfffffff7;
    local_68->u64 = local_70 | 0xfffb800000000000;
    local_10 = L_local;
    local_20 = "store to dead GC object";
    local_d0 = L_local->top;
    L_local->top = local_d0 + 1;
    local_c8 = L_local;
    local_d8 = _vmstate_local;
    local_a8 = L_local;
    local_b8 = _vmstate_local;
    local_bc = 0xfffffff9;
    local_98 = _vmstate_local;
    local_9c = 0xfffffff9;
    local_d0->u64 = (ulong)_vmstate_local | 0xfffc800000000000;
    local_78 = L_local;
    local_88 = "store to dead GC object";
    local_e0 = L_local->top;
    L_local->top = local_e0 + 1;
    local_e4 = key.field_4.it;
    local_e0->n = (double)(int)key.field_4.it;
    pTVar1 = L_local->top;
    L_local->top = pTVar1 + 1;
    local_b0 = local_d0;
    local_90 = local_d0;
    local_80 = local_d0;
    local_50 = local_70;
    local_48 = local_68;
    local_30 = local_70;
    local_28 = local_68;
    local_18 = local_68;
    L2_local = (lua_State *)lj_str_new(L_local,&local_179,1);
    local_120 = local_140;
    local_134 = 0xfffffffb;
    local_114 = 0xfffffffb;
    pTVar1->u64 = (ulong)L2_local | 0xfffd800000000000;
    local_f0 = local_140;
    local_100 = "store to dead GC object";
    local_148 = pTVar1;
    local_130 = L2_local;
    local_128 = pTVar1;
    local_110 = L2_local;
    local_108 = pTVar1;
    local_f8 = pTVar1;
    iVar3 = lua_pcall(L_local,3,0,0);
    if (iVar3 != 0) {
      if (*(long *)((L_local->glref).ptr64 + 0x160) != 0) {
        (**(code **)((L_local->glref).ptr64 + 0x160))(L_local);
      }
      exit(1);
    }
    uVar2 = (L_local->glref).ptr64;
    *(uint *)(uVar2 + 0x3c4) = *(uint *)(uVar2 + 0x3c4) & 0xffffffef;
  }
  return;
}

Assistant:

static void jit_profile_callback(lua_State *L2, lua_State *L, int samples,
				 int vmstate)
{
  TValue key;
  cTValue *tv;
  key.u64 = KEY_PROFILE_FUNC;
  tv = lj_tab_get(L, tabV(registry(L)), &key);
  if (tvisfunc(tv)) {
    char vmst = (char)vmstate;
    int status;
    setfuncV(L2, L2->top++, funcV(tv));
    setthreadV(L2, L2->top++, L);
    setintV(L2->top++, samples);
    setstrV(L2, L2->top++, lj_str_new(L2, &vmst, 1));
    status = lua_pcall(L2, 3, 0, 0);  /* callback(thread, samples, vmstate) */
    if (status) {
      if (G(L2)->panic) G(L2)->panic(L2);
      exit(EXIT_FAILURE);
    }
    lj_trace_abort(G(L2));
  }
}